

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitSectors.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::track_for_sectors
          (Disk *this,uint8_t *source,int number_of_sectors,uint8_t track,uint8_t side,
          uint8_t first_sector,uint8_t size,Density density)

{
  uchar *__last;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  pointer pSVar1;
  undefined7 in_register_00000009;
  uchar *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar3;
  bool bVar4;
  shared_ptr<Storage::Disk::Track> sVar5;
  optional<unsigned_long> sector_gap_length;
  vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_> sectors;
  vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_> local_48
  ;
  
  puVar2 = (uchar *)CONCAT71(in_register_00000009,size);
  local_48.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0;
  if (0 < number_of_sectors) {
    iVar3 = number_of_sectors;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
    emplace_back<>(&local_48);
    local_48.
    super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].address.track = track;
    local_48.
    super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].address.side = side;
    local_48.
    super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].address.sector = first_sector;
    local_48.
    super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].size = size;
    pSVar1 = local_48.
             super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<>(&pSVar1->samples);
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
              (pSVar1->samples).
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = source + (0x80 << (size & 0x1f));
    puVar2 = __last;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (this_00,(const_iterator)*(uchar **)this_00,source,__last);
    first_sector = first_sector + '\x01';
    source = __last;
  }
  if (local_48.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->_vptr_Disk = (_func_int **)0x0;
    this[1]._vptr_Disk = (_func_int **)0x0;
  }
  else {
    sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = 0;
    sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)puVar2;
    Encodings::MFM::TrackWithSectors
              ((MFM *)this,density,&local_48,sector_gap_length,(optional<unsigned_char>)0x0);
  }
  std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
  ~vector(&local_48);
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> Storage::Disk::track_for_sectors(
	const uint8_t *const source,
	int number_of_sectors,
	uint8_t track,
	uint8_t side,
	uint8_t first_sector,
	uint8_t size,
	Storage::Encodings::MFM::Density density
) {
	std::vector<Storage::Encodings::MFM::Sector> sectors;

	size_t byte_size = size_t(128 << size);
	size_t source_pointer = 0;
	for(int sector = 0; sector < number_of_sectors; sector++) {
		sectors.emplace_back();

		Storage::Encodings::MFM::Sector &new_sector = sectors.back();
		new_sector.address.track = track;
		new_sector.address.side = side;
		new_sector.address.sector = first_sector;
		first_sector++;
		new_sector.size = size;

		new_sector.samples.emplace_back();
		new_sector.samples[0].insert(new_sector.samples[0].begin(), source + source_pointer, source + source_pointer + byte_size);
		source_pointer += byte_size;
	}

	if(!sectors.empty()) {
		return TrackWithSectors(density, sectors);
	}

	return nullptr;
}